

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O0

size_t __thiscall charls_jpegls_encoder::estimated_destination_size(charls_jpegls_encoder *this)

{
  bool expression;
  uint32_t uVar1;
  size_t sVar2;
  charls_jpegls_encoder *this_local;
  
  expression = is_frame_info_configured(this);
  charls::check_operation(expression);
  sVar2 = charls::checked_mul((ulong)(this->frame_info_).width,(ulong)(this->frame_info_).height);
  sVar2 = charls::checked_mul(sVar2,(long)(this->frame_info_).component_count);
  uVar1 = charls::bit_to_byte_count((this->frame_info_).bits_per_sample);
  sVar2 = charls::checked_mul(sVar2,(ulong)uVar1);
  return sVar2 + 0x422;
}

Assistant:

size_t estimated_destination_size() const
    {
        check_operation(is_frame_info_configured());
        return checked_mul(checked_mul(checked_mul(frame_info_.width, frame_info_.height), frame_info_.component_count),
                           bit_to_byte_count(frame_info_.bits_per_sample)) +
               1024 + spiff_header_size_in_bytes;
    }